

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall
wabt::TypeChecker::OnSimdLoadLane(TypeChecker *this,Opcode opcode,Limits *limits,uint64_t lane_idx)

{
  uint32_t uVar1;
  Result RVar2;
  ulong uVar3;
  Opcode local_2c;
  
  local_2c.enum_ = opcode.enum_;
  uVar1 = Opcode::GetSimdLaneCount(&local_2c);
  uVar3 = (ulong)uVar1;
  if (uVar3 <= lane_idx) {
    PrintError(this,"lane index must be less than %d (got %lu)",uVar3,lane_idx);
  }
  RVar2 = CheckOpcode2(this,local_2c,limits);
  RVar2.enum_._0_1_ = RVar2.enum_ == Error || uVar3 <= lane_idx;
  RVar2.enum_._1_3_ = 0;
  return (Result)RVar2.enum_;
}

Assistant:

Result TypeChecker::OnSimdLoadLane(Opcode opcode,
                                   const Limits& limits,
                                   uint64_t lane_idx) {
  Result result = Result::Ok;
  uint32_t lane_count = opcode.GetSimdLaneCount();
  if (lane_idx >= lane_count) {
    PrintError("lane index must be less than %d (got %" PRIu64 ")", lane_count,
               lane_idx);
    result = Result::Error;
  }
  result |= CheckOpcode2(opcode, &limits);
  return result;
}